

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_generic_isset_method
          (t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  ostream *poVar2;
  reference pptVar3;
  string *psVar4;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  t_field *local_a8;
  t_field *field;
  t_field **local_98;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,
                           "// Returns true if field corresponding to fieldID is set (has been assigned a value) and false otherwise"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar2,"bool isSet(int fieldID)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50," ",&local_51);
  scope_up(this,out,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar2,"switch (fieldID)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88," ",&local_89);
  scope_up(this,out,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_98 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_98;
  while( true ) {
    field = (t_field *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field);
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    local_a8 = *pptVar3;
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"case ");
    psVar4 = t_field::get_name_abi_cxx11_(local_a8);
    std::__cxx11::string::string((string *)&local_e8,(string *)psVar4);
    t_oop_generator::upcase_string(&local_c8,&this->super_t_oop_generator,&local_e8);
    poVar2 = std::operator<<(poVar2,(string *)&local_c8);
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    t_generator::indent_up((t_generator *)this);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"return ");
    generate_isset_check_abi_cxx11_(&local_108,this,local_a8);
    poVar2 = std::operator<<(poVar2,(string *)&local_108);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_108);
    t_generator::indent_down((t_generator *)this);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"default:");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"throw new ArgumentError(\"Field $fieldID doesn\'t exist!\");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  std::__cxx11::string::string((string *)&local_128,(string *)&::endl_abi_cxx11_);
  scope_down(this,out,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&local_148,(string *)&endl2_abi_cxx11_);
  scope_down(this,out,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  return;
}

Assistant:

void t_dart_generator::generate_generic_isset_method(std::ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // create the isSet method
  indent(out) << "// Returns true if field corresponding to fieldID is set (has been assigned a "
                 "value) and false otherwise" << endl;
  indent(out) << "bool isSet(int fieldID)";
  scope_up(out);

  indent(out) << "switch (fieldID)";
  scope_up(out);

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = *f_iter;
    indent(out) << "case " << upcase_string(field->get_name()) << ":" << endl;
    indent_up();
    indent(out) << "return " << generate_isset_check(field) << ";" << endl;
    indent_down();
  }

  indent(out) << "default:" << endl;
  indent_up();
  indent(out) << "throw new ArgumentError(\"Field $fieldID doesn't exist!\");" << endl;
  indent_down();

  scope_down(out);  // switch
  scope_down(out, endl2);  // method
}